

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O2

scoped_fd * __thiscall phosg::scoped_fd::operator=(scoped_fd *this,scoped_fd *other)

{
  close(this,(int)other);
  this->fd = other->fd;
  other->fd = -1;
  return this;
}

Assistant:

scoped_fd& scoped_fd::operator=(scoped_fd&& other) {
  this->close();
  this->fd = other.fd;
  other.fd = -1;
  return *this;
}